

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O2

void __thiscall
basist::basisu_lowlevel_etc1s_transcoder::clear(basisu_lowlevel_etc1s_transcoder *this)

{
  basisu::vector<basist::endpoint>::clear(&this->m_local_endpoints);
  basisu::vector<basist::selector>::clear(&this->m_local_selectors);
  huffman_decoding_table::clear(&this->m_endpoint_pred_model);
  huffman_decoding_table::clear(&this->m_delta_endpoint_model);
  huffman_decoding_table::clear(&this->m_selector_model);
  huffman_decoding_table::clear(&this->m_selector_history_buf_rle_model);
  this->m_selector_history_buf_size = 0;
  return;
}

Assistant:

void clear()
		{
			m_local_endpoints.clear();
			m_local_selectors.clear();
			m_endpoint_pred_model.clear();
			m_delta_endpoint_model.clear();
			m_selector_model.clear();
			m_selector_history_buf_rle_model.clear();
			m_selector_history_buf_size = 0;
		}